

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

CallExpr __thiscall
mp::BasicExprFactory<std::allocator<char>_>::EndIterated<mp::CallExpr>
          (BasicExprFactory<std::allocator<char>_> *this,
          BasicIteratedExprBuilder<mp::CallExpr> builder)

{
  CallExpr CVar1;
  AssertionFailure *this_00;
  
  if ((builder.impl_)->num_args == builder.arg_index_) {
    CVar1 = internal::ExprBase::Create<mp::CallExpr>(&(builder.impl_)->super_Impl);
    return (CallExpr)
           CVar1.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.super_ExprBase.impl_;
  }
  this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
  AssertionFailure::AssertionFailure(this_00,"too few arguments");
  __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

ExprType EndIterated(BasicIteratedExprBuilder<ExprType> builder) {
    typename ExprType::Impl *impl = builder.impl_;
    /// Check that all arguments provided.
    MP_ASSERT(builder.arg_index_ == impl->num_args, "too few arguments");
    return Expr::Create<ExprType>(impl);
  }